

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::C_formatter<spdlog::details::null_scoped_padder>::format
          (C_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  byte bVar1;
  size_t sVar2;
  buffer<char> *buf;
  ulong uVar3;
  basic_string_view<char> fmt;
  format_handler<char> local_68;
  undefined8 local_30;
  undefined1 *local_28;
  undefined8 local_20;
  
  local_28 = (undefined1 *)&local_68;
  local_68.parse_ctx.fmt_.data_._0_4_ = tm_time->tm_year % 100;
  if ((uint)local_68.parse_ctx.fmt_.data_ < 100) {
    bVar1 = (byte)(((uint)local_68.parse_ctx.fmt_.data_ & 0xff) / 10);
    sVar2 = (dest->super_buffer<char>).size_;
    uVar3 = sVar2 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar3) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar3);
      sVar2 = (dest->super_buffer<char>).size_;
      uVar3 = sVar2 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar3;
    (dest->super_buffer<char>).ptr_[sVar2] = bVar1 | 0x30;
    sVar2 = (dest->super_buffer<char>).size_;
    uVar3 = sVar2 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar3) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar3);
      sVar2 = (dest->super_buffer<char>).size_;
      uVar3 = sVar2 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar3;
    (dest->super_buffer<char>).ptr_[sVar2] =
         (char)(uint)local_68.parse_ctx.fmt_.data_ + bVar1 * -10 | 0x30;
  }
  else {
    local_68.ctx.out_.container = (buffer<char> *)0x15ba94;
    local_68.ctx.args_.desc_ = 5;
    local_68.ctx.args_.field_1._0_4_ = 0;
    local_30 = 1;
    local_20 = 0;
    fmt.size_ = (size_t)&local_68.ctx;
    fmt.data_ = (char *)0x5;
    local_68.ctx.loc_.locale_ = dest;
    ::fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_handler<char>>
              ((detail *)"{:02}",fmt,&local_68);
  }
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad2(tm_time.tm_year % 100, dest);
    }